

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOBLoader.cpp
# Opt level: O0

void __thiscall Assimp::LWOImporter::LoadLWOBSurface(LWOImporter *this,uint size)

{
  vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_> *this_00;
  byte bVar1;
  uint16_t uVar2;
  reference out;
  Logger *pLVar3;
  DeadlyImportError *pDVar4;
  float fVar5;
  undefined4 extraout_XMM0_Db;
  double dVar6;
  allocator local_329;
  undefined1 local_328 [4];
  uint16_t s;
  undefined1 local_302;
  allocator local_301;
  string local_300;
  undefined1 local_2da;
  allocator local_2d9;
  string local_2d8;
  undefined1 local_2b2;
  allocator local_2b1;
  string local_2b0;
  uint16_t local_28c;
  undefined1 local_28a;
  allocator local_289;
  undefined1 local_288 [4];
  uint16_t flag;
  undefined1 local_262;
  allocator local_261;
  string local_260;
  undefined1 local_23a;
  allocator local_239;
  string local_238;
  undefined1 local_212;
  allocator local_211;
  string local_210;
  undefined1 local_1ea;
  allocator local_1e9;
  string local_1e8;
  undefined1 local_1c2;
  allocator local_1c1;
  string local_1c0;
  uint8_t *local_1a0;
  uint8_t *next;
  ushort uStack_190;
  undefined2 uStack_18e;
  SubChunkHeader head;
  bool running;
  Texture *pTex;
  Surface *surf;
  Surface local_168;
  uint8_t *local_20;
  uint8_t *end;
  LWOImporter *pLStack_10;
  uint size_local;
  LWOImporter *this_local;
  
  local_20 = this->mFileBuffer + size;
  this_00 = this->mSurfaces;
  end._4_4_ = size;
  pLStack_10 = this;
  LWO::Surface::Surface(&local_168);
  std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>::push_back
            (this_00,&local_168);
  LWO::Surface::~Surface(&local_168);
  out = std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>::back
                  (this->mSurfaces);
  stack0xfffffffffffffe78 = (Texture *)0x0;
  GetS0(this,&out->mName,end._4_4_);
  head.type._3_1_ = 1;
  while (((head.type._3_1_ & 1) != 0 && (this->mFileBuffer + 6 < local_20))) {
    register0x00000000 = IFF::LoadSubChunk(&this->mFileBuffer);
    if (local_20 < this->mFileBuffer + (int)(uint)uStack_190) {
      pLVar3 = DefaultLogger::get();
      Logger::error(pLVar3,"LWOB: Invalid surface chunk length. Trying to continue.");
      uStack_190 = (short)local_20 - (short)this->mFileBuffer;
    }
    local_1a0 = this->mFileBuffer + uStack_190;
    if (next._4_4_ == 0x42544558) {
      register0x00000000 = SetupNewTextureLWOB(this,&out->mBumpTextures,(uint)uStack_190);
    }
    else if (next._4_4_ == 0x434f4c52) {
      if (uStack_190 < 3) {
        local_1c2 = 1;
        pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1c0,"LWO: COLR chunk is too small",&local_1c1)
        ;
        DeadlyImportError::DeadlyImportError(pDVar4,&local_1c0);
        local_1c2 = 0;
        __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      bVar1 = GetU1(this);
      (out->mColor).r = (float)bVar1 / 255.0;
      bVar1 = GetU1(this);
      (out->mColor).g = (float)bVar1 / 255.0;
      bVar1 = GetU1(this);
      (out->mColor).b = (float)bVar1 / 255.0;
    }
    else if (next._4_4_ == 0x43544558) {
      register0x00000000 = SetupNewTextureLWOB(this,&out->mColorTextures,(uint)uStack_190);
    }
    else if (next._4_4_ == 0x44494646) {
      if (uStack_190 < 2) {
        local_1ea = 1;
        pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1e8,"LWO: DIFF chunk is too small",&local_1e9)
        ;
        DeadlyImportError::DeadlyImportError(pDVar4,&local_1e8);
        local_1ea = 0;
        __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      uVar2 = GetU2(this);
      out->mDiffuseValue = (float)uVar2 / 255.0;
    }
    else if (next._4_4_ == 0x44544558) {
      register0x00000000 = SetupNewTextureLWOB(this,&out->mDiffuseTextures,(uint)uStack_190);
    }
    else if (next._4_4_ == 0x464c4147) {
      if (uStack_190 < 2) {
        local_28a = 1;
        pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_288,"LWO: FLAG chunk is too small",&local_289);
        DeadlyImportError::DeadlyImportError(pDVar4,(string *)local_288);
        local_28a = 0;
        __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      local_28c = GetU2(this);
      if ((local_28c & 4) != 0) {
        out->mMaximumSmoothAngle = 1.56207;
      }
      if ((local_28c & 8) != 0) {
        out->mColorHighlights = 1.0;
      }
      if ((local_28c & 0x100) != 0) {
        out->bDoubleSided = true;
      }
    }
    else if (next._4_4_ == 0x474c4f53) {
      if (uStack_190 < 2) {
        local_2da = 1;
        pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_2d8,"LWO: GLOS chunk is too small",&local_2d9)
        ;
        DeadlyImportError::DeadlyImportError(pDVar4,&local_2d8);
        local_2da = 0;
        __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      uVar2 = GetU2(this);
      out->mGlossiness = (float)uVar2;
    }
    else if (next._4_4_ == 0x4c554d49) {
      if (uStack_190 < 2) {
        local_23a = 1;
        pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_238,"LWO: LUMI chunk is too small",&local_239)
        ;
        DeadlyImportError::DeadlyImportError(pDVar4,&local_238);
        local_23a = 0;
        __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      uVar2 = GetU2(this);
      out->mLuminosity = (float)uVar2 / 255.0;
    }
    else if (next._4_4_ == 0x534d414e) {
      if (uStack_190 < 4) {
        local_2b2 = 1;
        pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_2b0,"LWO: SMAN chunk is too small",&local_2b1)
        ;
        DeadlyImportError::DeadlyImportError(pDVar4,&local_2b0);
        local_2b2 = 0;
        __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      fVar5 = GetF4(this);
      dVar6 = std::fabs((double)CONCAT44(extraout_XMM0_Db,fVar5));
      out->mMaximumSmoothAngle = SUB84(dVar6,0);
    }
    else if (next._4_4_ == 0x53504543) {
      if (uStack_190 < 2) {
        local_212 = 1;
        pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_210,"LWO: SPEC chunk is too small",&local_211)
        ;
        DeadlyImportError::DeadlyImportError(pDVar4,&local_210);
        local_212 = 0;
        __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      uVar2 = GetU2(this);
      out->mSpecularValue = (float)uVar2 / 255.0;
    }
    else if (next._4_4_ == 0x53544558) {
      register0x00000000 = SetupNewTextureLWOB(this,&out->mSpecularTextures,(uint)uStack_190);
    }
    else if (next._4_4_ == 0x54464c47) {
      if (uStack_190 < 2) {
        pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_328,"LWO: TFLG chunk is too small",&local_329);
        DeadlyImportError::DeadlyImportError(pDVar4,(string *)local_328);
        __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      if (stack0xfffffffffffffe78 == (Texture *)0x0) {
        pLVar3 = DefaultLogger::get();
        Logger::warn(pLVar3,"LWOB: Unexpected TFLG chunk");
      }
      else {
        uVar2 = GetU2(this);
        if ((uVar2 & 1) == 0) {
          if ((uVar2 & 2) == 0) {
            if ((uVar2 & 4) != 0) {
              stack0xfffffffffffffe78->majorAxis = AXIS_Z;
            }
          }
          else {
            stack0xfffffffffffffe78->majorAxis = AXIS_Y;
          }
        }
        else {
          stack0xfffffffffffffe78->majorAxis = AXIS_X;
        }
        if ((uVar2 & 0x10) != 0) {
          pLVar3 = DefaultLogger::get();
          Logger::warn(pLVar3,"LWOB: Ignoring \'negate\' flag on texture");
        }
      }
    }
    else if (next._4_4_ == 0x54494d47) {
      if (stack0xfffffffffffffe78 == (Texture *)0x0) {
        pLVar3 = DefaultLogger::get();
        Logger::warn(pLVar3,"LWOB: Unexpected TIMG chunk");
      }
      else {
        GetS0(this,&stack0xfffffffffffffe78->mFileName,(uint)uStack_190);
      }
    }
    else if (next._4_4_ == 0x5452414e) {
      if (uStack_190 < 2) {
        local_262 = 1;
        pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_260,"LWO: TRAN chunk is too small",&local_261)
        ;
        DeadlyImportError::DeadlyImportError(pDVar4,&local_260);
        local_262 = 0;
        __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      uVar2 = GetU2(this);
      out->mTransparency = (float)uVar2 / 255.0;
    }
    else if (next._4_4_ == 0x54544558) {
      register0x00000000 = SetupNewTextureLWOB(this,&out->mOpacityTextures,(uint)uStack_190);
    }
    else if (next._4_4_ == 0x5456414c) {
      if (uStack_190 == 0) {
        local_302 = 1;
        pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_300,"LWO: TVAL chunk is too small",&local_301)
        ;
        DeadlyImportError::DeadlyImportError(pDVar4,&local_300);
        local_302 = 0;
        __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      if (stack0xfffffffffffffe78 == (Texture *)0x0) {
        pLVar3 = DefaultLogger::get();
        Logger::error(pLVar3,"LWOB: Unexpected TVAL chunk");
      }
      else {
        bVar1 = GetU1(this);
        stack0xfffffffffffffe78->mStrength = (float)bVar1 / 255.0;
      }
    }
    this->mFileBuffer = local_1a0;
  }
  return;
}

Assistant:

void LWOImporter::LoadLWOBSurface(unsigned int size)
{
    LE_NCONST uint8_t* const end = mFileBuffer + size;

    mSurfaces->push_back( LWO::Surface () );
    LWO::Surface& surf = mSurfaces->back();
    LWO::Texture* pTex = NULL;

    GetS0(surf.mName,size);
    bool running = true;
    while (running)    {
        if (mFileBuffer + 6 >= end)
            break;

        IFF::SubChunkHeader head = IFF::LoadSubChunk(mFileBuffer);

        /*  A single test file (sonycam.lwo) seems to have invalid surface chunks.
         *  I'm assuming it's the fault of a single, unknown exporter so there are
         *  probably THOUSANDS of them. Here's a dirty workaround:
         *
         *  We don't break if the chunk limit is exceeded. Instead, we're computing
         *  how much storage is actually left and work with this value from now on.
         */
        if (mFileBuffer + head.length > end) {
            ASSIMP_LOG_ERROR("LWOB: Invalid surface chunk length. Trying to continue.");
            head.length = (uint16_t) (end - mFileBuffer);
        }

        uint8_t* const next = mFileBuffer+head.length;
        switch (head.type)
        {
        // diffuse color
        case AI_LWO_COLR:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,COLR,3);
                surf.mColor.r = GetU1() / 255.0f;
                surf.mColor.g = GetU1() / 255.0f;
                surf.mColor.b = GetU1() / 255.0f;
                break;
            }
        // diffuse strength ...
        case AI_LWO_DIFF:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,DIFF,2);
                surf.mDiffuseValue = GetU2() / 255.0f;
                break;
            }
        // specular strength ...
        case AI_LWO_SPEC:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,SPEC,2);
                surf.mSpecularValue = GetU2() / 255.0f;
                break;
            }
        // luminosity ...
        case AI_LWO_LUMI:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,LUMI,2);
                surf.mLuminosity = GetU2() / 255.0f;
                break;
            }
        // transparency
        case AI_LWO_TRAN:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,TRAN,2);
                surf.mTransparency = GetU2() / 255.0f;
                break;
            }
        // surface flags
        case AI_LWO_FLAG:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,FLAG,2);
                uint16_t flag = GetU2();
                if (flag & 0x4 )   surf.mMaximumSmoothAngle = 1.56207f;
                if (flag & 0x8 )   surf.mColorHighlights = 1.f;
                if (flag & 0x100)  surf.bDoubleSided = true;
                break;
            }
        // maximum smoothing angle
        case AI_LWO_SMAN:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,SMAN,4);
                surf.mMaximumSmoothAngle = std::fabs( GetF4() );
                break;
            }
        // glossiness
        case AI_LWO_GLOS:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,GLOS,2);
                surf.mGlossiness = (float)GetU2();
                break;
            }
        // color texture
        case AI_LWO_CTEX:
            {
                pTex = SetupNewTextureLWOB(surf.mColorTextures,
                    head.length);
                break;
            }
        // diffuse texture
        case AI_LWO_DTEX:
            {
                pTex = SetupNewTextureLWOB(surf.mDiffuseTextures,
                    head.length);
                break;
            }
        // specular texture
        case AI_LWO_STEX:
            {
                pTex = SetupNewTextureLWOB(surf.mSpecularTextures,
                    head.length);
                break;
            }
        // bump texture
        case AI_LWO_BTEX:
            {
                pTex = SetupNewTextureLWOB(surf.mBumpTextures,
                    head.length);
                break;
            }
        // transparency texture
        case AI_LWO_TTEX:
            {
                pTex = SetupNewTextureLWOB(surf.mOpacityTextures,
                    head.length);
                break;
            }
        // texture path
        case AI_LWO_TIMG:
            {
                if (pTex)   {
                    GetS0(pTex->mFileName,head.length);
                } else {
                    ASSIMP_LOG_WARN("LWOB: Unexpected TIMG chunk");
                }
                break;
            }
        // texture strength
        case AI_LWO_TVAL:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,TVAL,1);
                if (pTex)   {
                    pTex->mStrength = (float)GetU1()/ 255.f;
                } else {
                    ASSIMP_LOG_ERROR("LWOB: Unexpected TVAL chunk");
                }
                break;
            }
        // texture flags
        case AI_LWO_TFLG:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,TFLG,2);

                if (nullptr != pTex) {
                    const uint16_t s = GetU2();
                    if (s & 1)
                        pTex->majorAxis = LWO::Texture::AXIS_X;
                    else if (s & 2)
                        pTex->majorAxis = LWO::Texture::AXIS_Y;
                    else if (s & 4)
                        pTex->majorAxis = LWO::Texture::AXIS_Z;

                    if (s & 16) {
                        ASSIMP_LOG_WARN("LWOB: Ignoring \'negate\' flag on texture");
                    }
                }
                else {
                    ASSIMP_LOG_WARN("LWOB: Unexpected TFLG chunk");
                }
                break;
            }
        }
        mFileBuffer = next;
    }
}